

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O1

bool dxil_spv::validate_wmma_io_registers
               (Impl *impl,uint32_t base_argument,
               AmdExtD3DShaderIntrinsicsWaveMatrixRegType reg_type,uint32_t phase,
               bool input_validation)

{
  __buckets_ptr pp_Var1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  Id IVar4;
  ValueKind VVar5;
  Id IVar6;
  Value *pVVar7;
  Value *pVVar8;
  Value *this;
  __node_base_ptr p_Var9;
  uint uVar10;
  __node_base_ptr p_Var11;
  _Hash_node_base *p_Var12;
  __hash_code __code_1;
  uint uVar13;
  __hash_code __code;
  ulong uVar14;
  _Hash_node_base *p_Var15;
  bool bVar16;
  bool bVar17;
  
  if (reg_type == AmdExtD3DShaderIntrinsicsWaveMatrixRegType_RetVal_Reg && !input_validation) {
    uVar13 = (impl->ags).instructions[base_argument].immediate;
    if (0xff < uVar13) {
      return false;
    }
    if ((impl->ags).instructions[base_argument].phase != phase) {
      return false;
    }
    bVar16 = false;
    uVar14 = 0;
    while (((uVar13 & 0xf) == ((uint)uVar14 & 3) &&
           (uVar13 >> 4 == ((uint)(uVar14 >> 2) & 0x3fffffff)))) {
      bVar16 = 6 < uVar14;
      if (uVar14 == 7) {
        return true;
      }
      uVar10 = base_argument + 1 + (uint)uVar14;
      uVar13 = (impl->ags).instructions[uVar10].immediate;
      if ((0xff < uVar13) || (uVar14 = uVar14 + 1, (impl->ags).instructions[uVar10].phase != phase))
      break;
    }
joined_r0x0017f771:
    if (!bVar16) {
      return false;
    }
  }
  else {
    pVVar7 = LLVMBC::Instruction::getOperand
                       (&(impl->ags).backdoor_instructions[base_argument]->super_Instruction,5);
    uVar14 = 0;
    IVar4 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
    do {
      uVar13 = base_argument + (int)uVar14;
      pVVar7 = LLVMBC::Instruction::getOperand
                         (&(impl->ags).backdoor_instructions[uVar13]->super_Instruction,5);
      pVVar8 = LLVMBC::Instruction::getOperand
                         (&(impl->ags).backdoor_instructions[uVar13]->super_Instruction,6);
      this = LLVMBC::Internal::resolve_proxy(pVVar7);
      VVar5 = LLVMBC::Value::get_value_kind(this);
      if (VVar5 == PHI) {
LAB_0017f494:
        pVVar7 = LLVMBC::Internal::resolve_proxy(pVVar8);
        VVar5 = LLVMBC::Value::get_value_kind(pVVar7);
        bVar17 = true;
        if (VVar5 != PHI) {
          pVVar7 = LLVMBC::Internal::resolve_proxy(pVVar8);
          VVar5 = LLVMBC::Value::get_value_kind(pVVar7);
          bVar17 = VVar5 == Load;
        }
      }
      else {
        pVVar7 = LLVMBC::Internal::resolve_proxy(pVVar7);
        VVar5 = LLVMBC::Value::get_value_kind(pVVar7);
        if (VVar5 == Load) goto LAB_0017f494;
        bVar17 = false;
      }
    } while ((uVar14 < 3) && (uVar14 = uVar14 + 1, bVar17));
    uVar14 = 0;
    bVar16 = false;
    do {
      uVar13 = (uint)uVar14 + base_argument;
      pVVar7 = LLVMBC::Instruction::getOperand
                         (&(impl->ags).backdoor_instructions[uVar13]->super_Instruction,5);
      pVVar8 = LLVMBC::Instruction::getOperand
                         (&(impl->ags).backdoor_instructions[uVar13]->super_Instruction,6);
      pp_Var1 = (impl->ags).coopmat_component_mapping._M_h._M_buckets;
      uVar2 = (impl->ags).coopmat_component_mapping._M_h._M_bucket_count;
      p_Var3 = pp_Var1[(ulong)pVVar7 % uVar2];
      p_Var9 = (__node_base_ptr)0x0;
      if ((p_Var3 != (__node_base_ptr)0x0) &&
         (p_Var9 = p_Var3, p_Var11 = p_Var3->_M_nxt, pVVar7 != (Value *)p_Var3->_M_nxt[1]._M_nxt)) {
        while (p_Var12 = p_Var11->_M_nxt, p_Var12 != (_Hash_node_base *)0x0) {
          p_Var9 = (__node_base_ptr)0x0;
          if (((ulong)p_Var12[1]._M_nxt % uVar2 != (ulong)pVVar7 % uVar2) ||
             (p_Var9 = p_Var11, p_Var11 = p_Var12, pVVar7 == (Value *)p_Var12[1]._M_nxt))
          goto LAB_0017f58a;
        }
        p_Var9 = (__node_base_ptr)0x0;
      }
LAB_0017f58a:
      if (p_Var9 == (__node_base_ptr)0x0) {
        p_Var12 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var12 = p_Var9->_M_nxt;
      }
      p_Var3 = pp_Var1[(ulong)pVVar8 % uVar2];
      p_Var9 = (__node_base_ptr)0x0;
      if ((p_Var3 != (__node_base_ptr)0x0) &&
         (p_Var9 = p_Var3, p_Var11 = p_Var3->_M_nxt, pVVar8 != (Value *)p_Var3->_M_nxt[1]._M_nxt)) {
        while (p_Var15 = p_Var11->_M_nxt, p_Var15 != (_Hash_node_base *)0x0) {
          p_Var9 = (__node_base_ptr)0x0;
          if (((ulong)p_Var15[1]._M_nxt % uVar2 != (ulong)pVVar8 % uVar2) ||
             (p_Var9 = p_Var11, p_Var11 = p_Var15, pVVar8 == (Value *)p_Var15[1]._M_nxt))
          goto LAB_0017f5e9;
        }
        p_Var9 = (__node_base_ptr)0x0;
      }
LAB_0017f5e9:
      if (p_Var9 == (__node_base_ptr)0x0) {
        p_Var15 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var15 = p_Var9->_M_nxt;
      }
      if (((((((impl->ags).instructions[uVar13].phase != phase) ||
             (p_Var12 == (_Hash_node_base *)0x0)) ||
            (uVar14 * 2 != (ulong)*(uint *)((long)&p_Var12[2]._M_nxt + 4))) ||
           (((!bVar17 && (IVar6 = Converter::Impl::get_id_for_value(impl,pVVar7,0), IVar6 != IVar4))
            || ((p_Var15 == (_Hash_node_base *)0x0 ||
                ((uVar14 * 2 | 1) != (ulong)*(uint *)((long)&p_Var15[2]._M_nxt + 4))))))) ||
          ((!bVar17 && (IVar6 = Converter::Impl::get_id_for_value(impl,pVVar8,0), IVar6 != IVar4))))
         || ((uVar13 = (impl->ags).instructions[uVar13].immediate, 0x7ff < uVar13 ||
             ((((uVar13 >> 8 & 0xff) != reg_type || ((uVar13 & 0xf) != ((uint)uVar14 & 1))) ||
              ((uVar13 >> 4 & 0xf) != ((uint)(uVar14 >> 1) & 0x7fffffff)))))))
      goto joined_r0x0017f771;
      bVar16 = 2 < uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar14 != 4);
  }
  return true;
}

Assistant:

static bool validate_wmma_io_registers(Converter::Impl &impl, uint32_t base_argument,
                                       AmdExtD3DShaderIntrinsicsWaveMatrixRegType reg_type,
                                       uint32_t phase, bool input_validation)
{
	if (reg_type == AmdExtD3DShaderIntrinsicsWaveMatrixRegType_RetVal_Reg && !input_validation)
	{
		// 8 outputs
		for (uint32_t i = 0; i < 8; i++)
		{
			uint32_t inst_index = base_argument + i;
			uint32_t imm = impl.ags.instructions[inst_index].immediate;
			uint32_t channel = get_matrix_io_channel(imm);
			uint32_t reg = get_matrix_io_register(imm);
			uint32_t type = get_matrix_io_type(imm);

			if (impl.ags.instructions[inst_index].phase != phase)
				return false;

			// Check for unexpected cases.
			if ((imm >> AmdExtD3DShaderIntrinsicsWaveMatrixModifier_MatrixTileShift) != 0)
				return false;
			if (type != reg_type)
				return false;
			if (channel != i % 4 || reg != i / 4)
				return false;
		}
	}
	else
	{
		spv::Id coopmat_id = impl.get_id_for_value(impl.ags.backdoor_instructions[base_argument]->getOperand(5));

		// If the matrix is PHI or loaded from alloca, we only check component mapping.
		bool all_phi_or_load = true;
		for (uint32_t i = 0; i < 4 && all_phi_or_load; i++)
		{
			uint32_t inst_index = base_argument + i;
			const auto *value0 = impl.ags.backdoor_instructions[inst_index]->getOperand(5);
			const auto *value1 = impl.ags.backdoor_instructions[inst_index]->getOperand(6);
			all_phi_or_load =
				(llvm::isa<llvm::PHINode>(value0) || llvm::isa<llvm::LoadInst>(value0)) &&
				(llvm::isa<llvm::PHINode>(value1) || llvm::isa<llvm::LoadInst>(value1));
		}

		// 4x2 inputs.
		for (uint32_t i = 0; i < 4; i++)
		{
			uint32_t inst_index = base_argument + i;
			const auto *value0 = impl.ags.backdoor_instructions[inst_index]->getOperand(5);
			const auto *value1 = impl.ags.backdoor_instructions[inst_index]->getOperand(6);
			auto itr0 = impl.ags.coopmat_component_mapping.find(value0);
			auto itr1 = impl.ags.coopmat_component_mapping.find(value1);

			if (impl.ags.instructions[inst_index].phase != phase)
				return false;

			// Don't accept any weird shuffle.
			if (itr0 == impl.ags.coopmat_component_mapping.end() || itr0->second.component != 2 * i + 0 ||
			    (!all_phi_or_load && impl.get_id_for_value(value0) != coopmat_id))
			{
				return false;
			}

			if (itr1 == impl.ags.coopmat_component_mapping.end() || itr1->second.component != 2 * i + 1 ||
			    (!all_phi_or_load && impl.get_id_for_value(value1) != coopmat_id))
			{
				return false;
			}

			uint32_t imm = impl.ags.instructions[inst_index].immediate;

			uint32_t channel = get_matrix_io_channel(imm);
			uint32_t reg = get_matrix_io_register(imm);
			uint32_t type = get_matrix_io_type(imm);

			// Check for unexpected cases.
			if ((imm >> AmdExtD3DShaderIntrinsicsWaveMatrixModifier_MatrixTileShift) != 0)
				return false;
			if (type != reg_type)
				return false;
			if (channel != i % 2 || reg != i / 2)
				return false;
		}
	}

	return true;
}